

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall
BackwardPass::ProcessStackSymUse(BackwardPass *this,StackSym *stackSym,BOOLEAN isNonByteCodeUse)

{
  BasicBlock *pBVar1;
  Loop *pLVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  RegSlot RVar6;
  Func *pFVar7;
  undefined4 *puVar8;
  StackSym *pSStack_38;
  RegSlot byteCodeRegSlot;
  StackSym *byteCodeUseSym;
  BasicBlock *block;
  BOOLEAN isNonByteCodeUse_local;
  StackSym *stackSym_local;
  BackwardPass *this_local;
  
  pBVar1 = this->currentBlock;
  bVar4 = DoByteCodeUpwardExposedUsed(this);
  if (((bVar4) && (isNonByteCodeUse == '\0')) &&
     (bVar4 = StackSym::HasByteCodeRegSlot(stackSym), bVar4)) {
    bVar4 = StackSym::IsTypeSpec(stackSym);
    pSStack_38 = stackSym;
    if (bVar4) {
      pSStack_38 = StackSym::GetVarEquivSym(stackSym,(Func *)0x0);
    }
    BVSparse<Memory::JitArenaAllocator>::Set
              (pBVar1->byteCodeUpwardExposedUsed,(pSStack_38->super_Sym).m_id);
    pFVar7 = StackSym::GetByteCodeFunc(pSStack_38);
    if ((pFVar7 == this->func) &&
       (RVar6 = StackSym::GetByteCodeRegSlot(pSStack_38),
       pBVar1->byteCodeRestoreSyms[RVar6] != pSStack_38)) {
      if (pBVar1->byteCodeRestoreSyms[RVar6] != (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x14cd,"(block->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr)",
                           "Can\'t have two active lifetime for the same byte code register");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      pBVar1->byteCodeRestoreSyms[RVar6] = pSStack_38;
    }
  }
  bVar4 = IsCollectionPass(this);
  if (bVar4) {
    this_local._7_1_ = true;
  }
  else {
    bVar4 = DoMarkTempNumbers(this);
    if (bVar4) {
      pLVar2 = pBVar1->loop;
      bVar4 = TempTrackerBase::HasTempTransferDependencies
                        ((TempTrackerBase *)pBVar1->tempNumberTracker);
      if ((pLVar2 != (Loop *)0x0) != bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x14dc,
                           "((block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies())"
                           ,
                           "(block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies()"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      TempTracker<NumberTemp>::ProcessUse(pBVar1->tempNumberTracker,stackSym,this);
    }
    bVar4 = DoMarkTempObjects(this);
    if (bVar4) {
      pLVar2 = pBVar1->loop;
      bVar4 = TempTrackerBase::HasTempTransferDependencies
                        ((TempTrackerBase *)pBVar1->tempObjectTracker);
      if ((pLVar2 != (Loop *)0x0) != bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x14e1,
                           "((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies())"
                           ,
                           "(block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies()"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      TempTracker<ObjectTemp>::ProcessUse(pBVar1->tempObjectTracker,stackSym,this);
    }
    bVar4 = DoMarkTempObjectVerify(this);
    if (bVar4) {
      pLVar2 = pBVar1->loop;
      bVar4 = TempTrackerBase::HasTempTransferDependencies
                        ((TempTrackerBase *)pBVar1->tempObjectVerifyTracker);
      if ((pLVar2 != (Loop *)0x0) != bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x14e7,
                           "((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies())"
                           ,
                           "(block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies()"
                          );
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      TempTracker<ObjectTempVerify>::ProcessUse(pBVar1->tempObjectVerifyTracker,stackSym,this);
    }
    BVar5 = BVSparse<Memory::JitArenaAllocator>::TestAndSet
                      (pBVar1->upwardExposedUses,(stackSym->super_Sym).m_id);
    this_local._7_1_ = BVar5 != '\0';
  }
  return this_local._7_1_;
}

Assistant:

bool
BackwardPass::ProcessStackSymUse(StackSym * stackSym, BOOLEAN isNonByteCodeUse)
{
    BasicBlock * block = this->currentBlock;

    if (this->DoByteCodeUpwardExposedUsed())
    {
        if (!isNonByteCodeUse && stackSym->HasByteCodeRegSlot())
        {
            // Always track the sym use on the var sym.
            StackSym * byteCodeUseSym = stackSym;
            if (byteCodeUseSym->IsTypeSpec())
            {
                // It has to have a var version for byte code regs
                byteCodeUseSym = byteCodeUseSym->GetVarEquivSym(nullptr);
            }

            block->byteCodeUpwardExposedUsed->Set(byteCodeUseSym->m_id);
#if DBG
            // We can only track first level function stack syms right now
            if (byteCodeUseSym->GetByteCodeFunc() == this->func)
            {
                Js::RegSlot byteCodeRegSlot = byteCodeUseSym->GetByteCodeRegSlot();
                if (block->byteCodeRestoreSyms[byteCodeRegSlot] != byteCodeUseSym)
                {
                    AssertMsg(block->byteCodeRestoreSyms[byteCodeRegSlot] == nullptr,
                        "Can't have two active lifetime for the same byte code register");
                    block->byteCodeRestoreSyms[byteCodeRegSlot] = byteCodeUseSym;
                }
            }
#endif
        }
    }

    if(IsCollectionPass())
    {
        return true;
    }

    if (this->DoMarkTempNumbers())
    {
        Assert((block->loop != nullptr) == block->tempNumberTracker->HasTempTransferDependencies());
        block->tempNumberTracker->ProcessUse(stackSym, this);
    }
    if (this->DoMarkTempObjects())
    {
        Assert((block->loop != nullptr) == block->tempObjectTracker->HasTempTransferDependencies());
        block->tempObjectTracker->ProcessUse(stackSym, this);
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        Assert((block->loop != nullptr) == block->tempObjectVerifyTracker->HasTempTransferDependencies());
        block->tempObjectVerifyTracker->ProcessUse(stackSym, this);
    }
#endif
    return !!block->upwardExposedUses->TestAndSet(stackSym->m_id);
}